

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void __thiscall QItemSelectionModel::setModel(QItemSelectionModel *this,QAbstractItemModel *model)

{
  QItemSelectionModelPrivate *pQVar1;
  parameter_type pQVar2;
  parameter_type in_RSI;
  QItemSelectionModelPrivate *d;
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *in_stack_00000070;
  QAbstractItemModel *in_stack_00000110;
  QItemSelectionModelPrivate *in_stack_00000118;
  
  pQVar1 = d_func((QItemSelectionModel *)0x83010c);
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  ::removeBindingUnlessInWrapper
            ((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
              *)d);
  pQVar2 = QPropertyData<QAbstractItemModel_*>::valueBypassingBindings
                     (&(pQVar1->model).super_QPropertyData<QAbstractItemModel_*>);
  if (pQVar2 != in_RSI) {
    QItemSelectionModelPrivate::initModel(in_stack_00000118,in_stack_00000110);
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::notify(in_stack_00000070);
  }
  return;
}

Assistant:

void QItemSelectionModel::setModel(QAbstractItemModel *model)
{
    Q_D(QItemSelectionModel);
    d->model.removeBindingUnlessInWrapper();
    if (d->model.valueBypassingBindings() == model)
        return;
    d->initModel(model);
    d->model.notify();
}